

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O1

Timer _delete<long,phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
                (vector<long,_std::allocator<long>_> *v,
                parallel_flat_hash_map<long,_long,_phmap::Hash<long>,_phmap::EqualTo<long>,_std::allocator<std::pair<const_long,_long>_>,_4UL,_phmap::NullMutex>
                *hash)

{
  time_point tVar1;
  long lVar2;
  long lVar3;
  anon_class_1_0_00000001 always_erase;
  anon_class_1_0_00000001 local_31;
  
  _fill_random<long,phmap::parallel_flat_hash_map<long,long,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>,4ul,phmap::NullMutex>>
            (v,hash);
  _shuffle<long>(v);
  tVar1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  lVar3 = (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
                ._M_start;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    lVar2 = 0;
    do {
      phmap::priv::
      parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<long,long>,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>>
      ::
      erase_if_impl<long,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<long,long>,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>>::erase<long>(long_const&)::_lambda(std::pair<long_const,long>const&)_1_,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<long,long>,phmap::Hash<long>,phmap::EqualTo<long>,std::allocator<std::pair<long_const,long>>>
                  *)hash,(key_arg<long> *)
                         ((long)(v->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar2),&local_31);
      lVar2 = lVar2 + 8;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return (Timer)(rep)tVar1.__d.__r;
}

Assistant:

Timer _delete(vector<T> &v, HT &hash)
{
    _fill_random(v, hash);
    _shuffle(v); // don't delete in insertion order

    Timer timer(true);

    for(size_t i = 0, sz = v.size(); i < sz; ++i)
        hash.erase(v[i]);
    return timer;
}